

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ScalarReplacementPass::TransferAnnotations
          (ScalarReplacementPass *this,Instruction *source,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  uint32_t uVar5;
  DecorationManager *this_01;
  reference ppIVar6;
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var7;
  Instruction *pIVar8;
  IRContext *pIVar9;
  Operand *pOVar10;
  pointer this_02;
  DefUseManager *this_03;
  iterator_template<spvtools::opt::Instruction> *this_04;
  Operand *local_1e8;
  undefined1 local_1d0 [16];
  Operand copy;
  allocator<spvtools::opt::Operand> local_18d;
  uint32_t i;
  _Manager_type local_188;
  _Invoker_type local_180;
  SmallVector<unsigned_int,_2UL> local_178;
  uint32_t local_14c;
  iterator local_148;
  undefined1 local_140 [48];
  Operand local_110;
  Operand OStack_e0;
  iterator local_b0;
  _func_int **local_a8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_88;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  annotation;
  Instruction *var;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range4;
  Decoration decoration;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *source_local;
  ScalarReplacementPass *this_local;
  
  this_01 = Pass::get_decoration_mgr((Pass *)this);
  uVar3 = opt::Instruction::result_id(source);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2,this_01,uVar3,false);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  inst = (Instruction *)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&inst);
    if (!bVar2) {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__begin2);
      return;
    }
    ppIVar6 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppIVar6;
    OVar4 = opt::Instruction::opcode(this_00);
    if (OVar4 != OpDecorate) break;
    uVar3 = opt::Instruction::GetSingleWordInOperand(this_00,1);
    if ((uVar3 == 0x12) || (uVar3 == 0x13)) {
      __end4 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin(replacements);
      var = (Instruction *)
            std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::end(replacements);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                         *)&var), bVar2) {
        p_Var7 = (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  *)__gnu_cxx::
                    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                    ::operator*(&__end4);
        annotation._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             *(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
               *)&p_Var7->super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
        if ((tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
            annotation._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
            (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
          pIVar8 = (Instruction *)::operator_new(0x70);
          pIVar9 = Pass::context((Pass *)this);
          local_14c = opt::Instruction::result_id
                                ((Instruction *)
                                 annotation._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                 _M_head_impl);
          local_148 = &local_14c;
          local_140._0_8_ = 1;
          init_list_00._M_len = 1;
          init_list_00._M_array = local_148;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_140 + 8),init_list_00);
          Operand::Operand(&local_110,SPV_OPERAND_TYPE_ID,(OperandData *)(local_140 + 8));
          local_188 = (_Manager_type)&i;
          local_180 = (_Invoker_type)0x1;
          init_list._M_len = 1;
          init_list._M_array = (iterator)local_188;
          i = uVar3;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_178,init_list);
          Operand::Operand(&OStack_e0,SPV_OPERAND_TYPE_DECORATION,&local_178);
          local_b0 = &local_110;
          local_a8 = (_func_int **)0x2;
          std::allocator<spvtools::opt::Operand>::allocator(&local_18d);
          __l._M_len = (size_type)local_a8;
          __l._M_array = local_b0;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                    (&local_a0,__l,&local_18d);
          opt::Instruction::Instruction(pIVar8,pIVar9,OpDecorate,0,0,&local_a0);
          std::
          unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
          unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                    ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                      *)&local_88,pIVar8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_a0);
          std::allocator<spvtools::opt::Operand>::~allocator(&local_18d);
          local_1e8 = (Operand *)&local_b0;
          do {
            local_1e8 = local_1e8 + -1;
            Operand::~Operand(local_1e8);
          } while (local_1e8 != &local_110);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_178);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_140 + 8));
          for (copy.words.large_data_._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl._4_4_ = 2;
              uVar1 = copy.words.large_data_._M_t.
                      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                      ._M_head_impl._4_4_, uVar5 = opt::Instruction::NumInOperands(this_00),
              uVar1 < uVar5;
              copy.words.large_data_._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl._4_4_ =
                   copy.words.large_data_._M_t.
                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl._4_4_ + 1) {
            pOVar10 = opt::Instruction::GetInOperand
                                (this_00,copy.words.large_data_._M_t.
                                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                         ._M_head_impl._4_4_);
            Operand::Operand((Operand *)(local_1d0 + 8),pOVar10);
            this_02 = std::
                      unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ::operator->(&local_88);
            opt::Instruction::AddOperand(this_02,(Operand *)(local_1d0 + 8));
            Operand::~Operand((Operand *)(local_1d0 + 8));
          }
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AddAnnotationInst(pIVar9,&local_88);
          this_03 = Pass::get_def_use_mgr((Pass *)this);
          Pass::context((Pass *)this);
          IRContext::annotation_end((IRContext *)local_1d0);
          this_04 = &InstructionList::iterator::operator--((iterator *)local_1d0)->super_iterator;
          pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*(this_04);
          analysis::DefUseManager::AnalyzeInstUse(this_03,pIVar8);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_88);
        }
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end4);
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x1bd,
                "void spvtools::opt::ScalarReplacementPass::TransferAnnotations(const Instruction *, std::vector<Instruction *> *)"
               );
}

Assistant:

void ScalarReplacementPass::TransferAnnotations(
    const Instruction* source, std::vector<Instruction*>* replacements) {
  // Only transfer invariant and restrict decorations on the variable. There are
  // no type or member decorations that are necessary to transfer.
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(source->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::Invariant ||
        decoration == spv::Decoration::Restrict) {
      for (auto var : *replacements) {
        if (var == nullptr) {
          continue;
        }

        std::unique_ptr<Instruction> annotation(new Instruction(
            context(), spv::Op::OpDecorate, 0, 0,
            std::initializer_list<Operand>{
                {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                {SPV_OPERAND_TYPE_DECORATION, {uint32_t(decoration)}}}));
        for (uint32_t i = 2; i < inst->NumInOperands(); ++i) {
          Operand copy(inst->GetInOperand(i));
          annotation->AddOperand(std::move(copy));
        }
        context()->AddAnnotationInst(std::move(annotation));
        get_def_use_mgr()->AnalyzeInstUse(&*--context()->annotation_end());
      }
    }
  }
}